

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linecontext.cpp
# Opt level: O3

void LineContext::testParseCpp(void)

{
  int *piVar1;
  QDebug QVar2;
  char cVar3;
  longlong lVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArray PARSE_CPP_FILE;
  LineContext context;
  QElapsedTimer timer;
  QDebug local_90;
  QString local_88;
  QByteArray local_70;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  LineContext local_38;
  undefined8 local_18;
  undefined8 local_10;
  
  qgetenv((char *)&local_70);
  cVar3 = QByteArray::isNull();
  if (cVar3 == '\0') {
    LineContext(&local_38);
    local_18 = 0x8000000000000000;
    local_10 = 0x8000000000000000;
    QElapsedTimer::start();
    QByteArrayView::QByteArrayView<QByteArray,_true>((QByteArrayView *)&local_88,&local_70);
    QVar5.m_data = (storage_type *)local_88.d.d;
    QVar5.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar5);
    init(&local_38,(EVP_PKEY_CTX *)&local_58);
    piVar1 = (int *)CONCAT44(uStack_54,local_58);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),2,8);
      }
    }
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_44 = 0;
    local_40 = anon_var_dwarf_51f72;
    QMessageLogger::debug();
    QVar2.stream = local_90.stream;
    QVar6.m_data = (storage_type *)0x10;
    QVar6.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_88);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    lVar4 = QElapsedTimer::elapsed();
    QTextStream::operator<<((QTextStream *)local_90.stream,lVar4);
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    QVar2.stream = local_90.stream;
    QVar7.m_data = (storage_type *)0x2;
    QVar7.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)QVar2.stream,&local_88);
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
      }
    }
    if (*(QTextStream *)(local_90.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_90.stream,' ');
    }
    QDebug::~QDebug(&local_90);
    dump(&local_38);
    QArrayDataPointer<LineContextItem>::~QArrayDataPointer(&local_38.mContext.d);
  }
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,1,8);
    }
  }
  return;
}

Assistant:

void LineContext::testParseCpp()
{
    auto PARSE_CPP_FILE = qgetenv("PARSE_CPP_FILE");
    if (PARSE_CPP_FILE.isNull()) {
        return;
    }
    LineContext context;
    QElapsedTimer timer;
    timer.start();
    context.init(QString::fromUtf8(PARSE_CPP_FILE));
    qDebug() << "context.init cpp" << timer.elapsed() << "ms";
    context.dump();
}